

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O2

void __thiscall
gl3cts::TransformFeedback::DiscardVertex::DiscardVertex
          (DiscardVertex *this,Context *context,char *test_name,char *test_description)

{
  CaptureVertexInterleaved::CaptureVertexInterleaved
            (&this->super_CaptureVertexInterleaved,context,test_name,test_description);
  (this->super_CaptureVertexInterleaved).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
       = (_func_int **)&PTR__CaptureVertexInterleaved_01dbae98;
  return;
}

Assistant:

gl3cts::TransformFeedback::DiscardVertex::DiscardVertex(deqp::Context& context, const char* test_name,
														const char* test_description)
	: CaptureVertexInterleaved(context, test_name, test_description)
{
}